

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O0

void __thiscall ExprWriter::visit(ExprWriter *this,AsmExpr *expr)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  reference ppVar4;
  ulong uVar5;
  long in_RSI;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
  *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*> *in;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
  *__range2_1;
  bool first_1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*> *out
  ;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
  *__range2;
  bool first;
  reference in_stack_ffffffffffffffa0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
  local_28;
  long local_20;
  byte local_11;
  long local_10;
  
  local_10 = in_RSI;
  poVar3 = std::operator<<((ostream *)
                           (in_RDI->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,"__asm__(\"");
  poVar3 = std::operator<<(poVar3,(string *)(local_10 + 0x18));
  poVar3 = std::operator<<(poVar3,"\"");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  in_RDI[1].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&((in_RDI[1].
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first).field_0x1;
  indent((ExprWriter *)in_stack_ffffffffffffffa0);
  std::operator<<((ostream *)
                  (in_RDI->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish,": ");
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
          ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                   *)in_stack_ffffffffffffffb0._M_current);
  if (!bVar1) {
    local_11 = 1;
    local_20 = local_10 + 0x38;
    local_28._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
            ::begin(in_RDI);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
    ::end(in_RDI);
    while ((bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                                *)in_stack_ffffffffffffffa0,
                               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                                *)in_RDI), bVar1 &&
           (ppVar4 = __gnu_cxx::
                     __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                     ::operator*(&local_28), ppVar4->second != (Expr *)0x0))) {
      if ((local_11 & 1) == 0) {
        std::operator<<((ostream *)
                        (in_RDI->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish,", ");
      }
      local_11 = 0;
      poVar3 = std::operator<<((ostream *)
                               (in_RDI->
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,(string *)ppVar4);
      std::operator<<(poVar3," (");
      (*ppVar4->second->_vptr_Expr[2])(ppVar4->second,in_RDI);
      std::operator<<((ostream *)
                      (in_RDI->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish,")");
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
      ::operator++(&local_28);
    }
  }
  std::ostream::operator<<
            ((in_RDI->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,std::endl<char,std::char_traits<char>>);
  indent((ExprWriter *)in_stack_ffffffffffffffa0);
  std::operator<<((ostream *)
                  (in_RDI->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish,": ");
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
          ::empty((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                   *)in_stack_ffffffffffffffb0._M_current);
  if (!bVar1) {
    bVar1 = true;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
    ::begin(in_RDI);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
    ::end(in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                               *)in_RDI), bVar2) {
      in_stack_ffffffffffffffa0 =
           __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
           ::operator*((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                        *)&stack0xffffffffffffffb0);
      if (!bVar1) {
        std::operator<<((ostream *)
                        (in_RDI->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish,", ");
      }
      bVar1 = false;
      poVar3 = std::operator<<((ostream *)
                               (in_RDI->
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,
                               (string *)in_stack_ffffffffffffffa0);
      std::operator<<(poVar3," (");
      (*in_stack_ffffffffffffffa0->second->_vptr_Expr[2])(in_stack_ffffffffffffffa0->second,in_RDI);
      std::operator<<((ostream *)
                      (in_RDI->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish,")");
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
      ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>_>
                    *)&stack0xffffffffffffffb0);
    }
  }
  std::ostream::operator<<
            ((in_RDI->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,std::endl<char,std::char_traits<char>>);
  indent((ExprWriter *)in_stack_ffffffffffffffa0);
  std::operator<<((ostream *)
                  (in_RDI->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish,": ");
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::operator<<((ostream *)
                    (in_RDI->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish,(string *)(local_10 + 0x68));
  }
  std::ostream::operator<<
            ((in_RDI->
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish,std::endl<char,std::char_traits<char>>);
  in_RDI[1].
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&in_RDI[1].
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].second + 7);
  indent((ExprWriter *)in_stack_ffffffffffffffa0);
  std::operator<<((ostream *)
                  (in_RDI->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish,")");
  return;
}

Assistant:

void ExprWriter::visit(AsmExpr& expr) {
    ss << "__asm__(\"" << expr.inst << "\"" << std::endl;
    indentCount++;
    indent();
    ss << ": ";
    if (!expr.output.empty()) {
        bool first = true;
        for (const auto& out : expr.output) {
            if (!out.second) {
                break;
            }
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << out.first << " (";
            out.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.input.empty()) {
        bool first = true;
        for (const auto& in : expr.input) {
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << in.first << " (";
            in.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.clobbers.empty()) {
        ss << expr.clobbers;
    }

    ss << std::endl;

    indentCount--;
    indent();
    ss << ")";

}